

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O2

size_t __thiscall adios2::VariableNT::SelectionSize(VariableNT *this)

{
  VariableBase *pointer;
  __type _Var1;
  size_t sVar2;
  allocator local_e3;
  allocator local_e2;
  allocator local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  pointer = this->m_Variable;
  std::__cxx11::string::string
            ((string *)&local_40,"in call to VariableNT::SelectionSize",(allocator *)&type);
  helper::CheckForNullptr<adios2::core::VariableBase>(pointer,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  adios2::ToString_abi_cxx11_((DataType)&type);
  GetType<std::__cxx11::string>();
  _Var1 = std::operator==(&type,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (_Var1) {
    sVar2 = adios2::core::Variable<std::__cxx11::string>::SelectionSize();
  }
  else {
    GetType<char>();
    _Var1 = std::operator==(&type,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    if (_Var1) {
      sVar2 = adios2::core::Variable<char>::SelectionSize();
    }
    else {
      GetType<signed_char>();
      _Var1 = std::operator==(&type,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      if (_Var1) {
        sVar2 = adios2::core::Variable<signed_char>::SelectionSize();
      }
      else {
        GetType<short>();
        _Var1 = std::operator==(&type,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        if (_Var1) {
          sVar2 = adios2::core::Variable<short>::SelectionSize();
        }
        else {
          GetType<int>();
          _Var1 = std::operator==(&type,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          if (_Var1) {
            sVar2 = adios2::core::Variable<int>::SelectionSize();
          }
          else {
            GetType<long>();
            _Var1 = std::operator==(&type,&local_e0);
            std::__cxx11::string::~string((string *)&local_e0);
            if (_Var1) {
              sVar2 = adios2::core::Variable<long>::SelectionSize();
            }
            else {
              GetType<unsigned_char>();
              _Var1 = std::operator==(&type,&local_e0);
              std::__cxx11::string::~string((string *)&local_e0);
              if (_Var1) {
                sVar2 = adios2::core::Variable<unsigned_char>::SelectionSize();
              }
              else {
                GetType<unsigned_short>();
                _Var1 = std::operator==(&type,&local_e0);
                std::__cxx11::string::~string((string *)&local_e0);
                if (_Var1) {
                  sVar2 = adios2::core::Variable<unsigned_short>::SelectionSize();
                }
                else {
                  GetType<unsigned_int>();
                  _Var1 = std::operator==(&type,&local_e0);
                  std::__cxx11::string::~string((string *)&local_e0);
                  if (_Var1) {
                    sVar2 = adios2::core::Variable<unsigned_int>::SelectionSize();
                  }
                  else {
                    GetType<unsigned_long>();
                    _Var1 = std::operator==(&type,&local_e0);
                    std::__cxx11::string::~string((string *)&local_e0);
                    if (_Var1) {
                      sVar2 = adios2::core::Variable<unsigned_long>::SelectionSize();
                    }
                    else {
                      GetType<float>();
                      _Var1 = std::operator==(&type,&local_e0);
                      std::__cxx11::string::~string((string *)&local_e0);
                      if (_Var1) {
                        sVar2 = adios2::core::Variable<float>::SelectionSize();
                      }
                      else {
                        GetType<double>();
                        _Var1 = std::operator==(&type,&local_e0);
                        std::__cxx11::string::~string((string *)&local_e0);
                        if (_Var1) {
                          sVar2 = adios2::core::Variable<double>::SelectionSize();
                        }
                        else {
                          GetType<long_double>();
                          _Var1 = std::operator==(&type,&local_e0);
                          std::__cxx11::string::~string((string *)&local_e0);
                          if (_Var1) {
                            sVar2 = adios2::core::Variable<long_double>::SelectionSize();
                          }
                          else {
                            GetType<std::complex<float>>();
                            _Var1 = std::operator==(&type,&local_e0);
                            std::__cxx11::string::~string((string *)&local_e0);
                            if (_Var1) {
                              sVar2 = adios2::core::Variable<std::complex<float>>::SelectionSize();
                            }
                            else {
                              GetType<std::complex<double>>();
                              _Var1 = std::operator==(&type,&local_e0);
                              std::__cxx11::string::~string((string *)&local_e0);
                              if (_Var1) {
                                sVar2 = adios2::core::Variable<std::complex<double>>::SelectionSize
                                                  ();
                              }
                              else {
                                std::__cxx11::string::string
                                          ((string *)&local_e0,"bindings::CXX11",&local_e1);
                                std::__cxx11::string::string
                                          ((string *)&local_60,"VariableNT",&local_e2);
                                std::__cxx11::string::string
                                          ((string *)&local_80,"SelectionSize",&local_e3);
                                std::operator+(&local_a0,"invalid data type ",&type);
                                helper::Throw<std::runtime_error>
                                          (&local_e0,&local_60,&local_80,&local_a0,-1);
                                std::__cxx11::string::~string((string *)&local_a0);
                                std::__cxx11::string::~string((string *)&local_80);
                                std::__cxx11::string::~string((string *)&local_60);
                                std::__cxx11::string::~string((string *)&local_e0);
                                sVar2 = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&type);
  return sVar2;
}

Assistant:

size_t VariableNT::SelectionSize() const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::SelectionSize");
    auto type = ToString(m_Variable->m_Type);
#define declare_type(T)                                                                            \
    if (type == GetType<T>())                                                                      \
    {                                                                                              \
        return reinterpret_cast<core::Variable<T> *>(m_Variable)->SelectionSize();                 \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "SelectionSize",
                                      "invalid data type " + type);
    return 0;
}